

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

float Abc_NtkComputeNodeLoad(Bus_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Flt_t *vWireCaps;
  int iVar1;
  Abc_Obj_t *p_00;
  float fVar2;
  int local_28;
  float local_24;
  int i;
  float Load;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  Bus_Man_t *p_local;
  
  fVar2 = Bus_SclObjLoad(pObj);
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    vWireCaps = p->vWireCaps;
    iVar1 = Abc_ObjFanoutNum(pObj);
    local_24 = Abc_SclFindWireLoad(vWireCaps,iVar1);
    for (local_28 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_28 < iVar1; local_28 = local_28 + 1) {
      p_00 = Abc_ObjFanout(pObj,local_28);
      fVar2 = Bus_SclObjCin(p_00);
      local_24 = fVar2 + local_24;
    }
    Bus_SclObjSetLoad(pObj,local_24);
    return local_24;
  }
  __assert_fail("Bus_SclObjLoad(pObj) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                ,0xd8,"float Abc_NtkComputeNodeLoad(Bus_Man_t *, Abc_Obj_t *)");
}

Assistant:

float Abc_NtkComputeNodeLoad( Bus_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load;
    int i;
    assert( Bus_SclObjLoad(pObj) == 0 );
    Load = Abc_SclFindWireLoad( p->vWireCaps, Abc_ObjFanoutNum(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Bus_SclObjCin( pFanout );
    Bus_SclObjSetLoad( pObj, Load );
    return Load;
}